

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * testing::internal::XmlUnitTestResultPrinter::RemoveInvalidXmlCharacters
                   (string *__return_storage_ptr__,string *str)

{
  byte __c;
  size_type sVar1;
  byte *pbVar2;
  byte *pbVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,str->_M_string_length);
  sVar1 = str->_M_string_length;
  if (sVar1 != 0) {
    pbVar2 = (byte *)(str->_M_dataplus)._M_p;
    pbVar3 = pbVar2;
    do {
      __c = *pbVar3;
      if (('\x1f' < (char)__c) || ((__c < 0xe && ((0x2600U >> (__c & 0x1f) & 1) != 0)))) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,__c);
        pbVar2 = (byte *)(str->_M_dataplus)._M_p;
        sVar1 = str->_M_string_length;
      }
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != pbVar2 + sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string XmlUnitTestResultPrinter::RemoveInvalidXmlCharacters(
    const std::string& str) {
  std::string output;
  output.reserve(str.size());
  for (std::string::const_iterator it = str.begin(); it != str.end(); ++it)
    if (IsValidXmlCharacter(*it))
      output.push_back(*it);

  return output;
}